

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

void __thiscall Fl_Shared_Image::reload(Fl_Shared_Image *this)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  Fl_Image *this_00;
  undefined4 extraout_var;
  long lVar4;
  uchar header [64];
  undefined4 local_68;
  undefined4 uStack_64;
  char local_60;
  Fl_Image *pFVar3;
  
  if ((this->name_ != (char *)0x0) &&
     (__stream = (FILE *)fl_fopen(this->name_,"rb"), __stream != (FILE *)0x0)) {
    fread(&local_68,1,0x40,__stream);
    fclose(__stream);
    if (CONCAT31((undefined3)uStack_64,local_68._3_1_) == 0x656e6966 && local_68 == 0x66656423) {
      this_00 = (Fl_Image *)operator_new(0x38);
      Fl_XBM_Image::Fl_XBM_Image((Fl_XBM_Image *)this_00,this->name_);
    }
    else if (local_60 == '/' && CONCAT44(uStack_64,local_68) == 0x2a204d5058202a2f) {
      this_00 = (Fl_Image *)operator_new(0x38);
      Fl_XPM_Image::Fl_XPM_Image((Fl_XPM_Image *)this_00,this->name_);
    }
    else if (num_handlers_ < 1) {
      this_00 = (Fl_Image *)0x0;
    }
    else {
      lVar4 = 0;
      do {
        this_00 = (*handlers_[lVar4])(this->name_,(uchar *)&local_68,0x40);
        if (this_00 != (Fl_Image *)0x0) break;
        lVar4 = lVar4 + 1;
        this_00 = (Fl_Image *)0x0;
      } while (lVar4 < num_handlers_);
    }
    if (this_00 != (Fl_Image *)0x0) {
      if ((this->alloc_image_ != 0) && (this->image_ != (Fl_Image *)0x0)) {
        (*this->image_->_vptr_Fl_Image[1])();
      }
      this->alloc_image_ = 1;
      uVar1 = (this->super_Fl_Image).w_;
      if ((this_00->w_ != uVar1 && uVar1 != 0) ||
         (iVar2 = (this->super_Fl_Image).h_, pFVar3 = this_00, iVar2 != 0 && this_00->h_ != iVar2))
      {
        iVar2 = (*this_00->_vptr_Fl_Image[2])
                          (this_00,(ulong)uVar1,(ulong)(uint)(this->super_Fl_Image).h_);
        pFVar3 = (Fl_Image *)CONCAT44(extraout_var,iVar2);
        (*this_00->_vptr_Fl_Image[1])(this_00);
      }
      this->image_ = pFVar3;
      if (pFVar3 != (Fl_Image *)0x0) {
        (this->super_Fl_Image).w_ = pFVar3->w_;
        (this->super_Fl_Image).h_ = pFVar3->h_;
        (this->super_Fl_Image).d_ = pFVar3->d_;
        iVar2 = pFVar3->count_;
        (this->super_Fl_Image).data_ = pFVar3->data_;
        (this->super_Fl_Image).count_ = iVar2;
      }
    }
  }
  return;
}

Assistant:

void Fl_Shared_Image::reload() {
  // Load image from disk...
  int		i;		// Looping var
  FILE		*fp;		// File pointer
  uchar		header[64];	// Buffer for auto-detecting files
  Fl_Image	*img;		// New image

  if (!name_) return;

  if ((fp = fl_fopen(name_, "rb")) != NULL) {
    if (fread(header, 1, sizeof(header), fp)==0) { /* ignore */ }
    fclose(fp);
  } else {
    return;
  }

  // Load the image as appropriate...
  if (memcmp(header, "#define", 7) == 0) // XBM file
    img = new Fl_XBM_Image(name_);
  else if (memcmp(header, "/* XPM */", 9) == 0) // XPM file
    img = new Fl_XPM_Image(name_);
  else {
    // Not a standard format; try an image handler...
    for (i = 0, img = 0; i < num_handlers_; i ++) {
      img = (handlers_[i])(name_, header, sizeof(header));

      if (img) break;
    }
  }

  if (img) {
    if (alloc_image_) delete image_;

    alloc_image_ = 1;

    if ((img->w() != w() && w()) || (img->h() != h() && h())) {
      // Make sure the reloaded image is the same size as the existing one.
      Fl_Image *temp = img->copy(w(), h());
      delete img;
      image_ = temp;
    } else {
      image_ = img;
    }

    update();
  }
}